

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O0

JsonMappingApi * __thiscall
cfd::js::api::json::JsonMappingApi::SetRawReissueAsset(JsonMappingApi *this,string *request_message)

{
  function<cfd::js::api::SetRawReissueAssetResponseStruct_(const_cfd::js::api::SetRawReissueAssetRequestStruct_&)>
  local_38;
  string *local_18;
  string *request_message_local;
  
  local_18 = request_message;
  request_message_local = (string *)this;
  std::
  function<cfd::js::api::SetRawReissueAssetResponseStruct(cfd::js::api::SetRawReissueAssetRequestStruct_const&)>
  ::
  function<cfd::js::api::SetRawReissueAssetResponseStruct(&)(cfd::js::api::SetRawReissueAssetRequestStruct_const&),void>
            ((function<cfd::js::api::SetRawReissueAssetResponseStruct(cfd::js::api::SetRawReissueAssetRequestStruct_const&)>
              *)&local_38,ElementsTransactionStructApi::SetRawReissueAsset);
  ExecuteJsonApi<cfd::js::api::json::SetRawReissueAssetRequest,cfd::js::api::json::SetRawReissueAssetResponse,cfd::js::api::SetRawReissueAssetRequestStruct,cfd::js::api::SetRawReissueAssetResponseStruct>
            ((json *)this,request_message,&local_38);
  std::
  function<cfd::js::api::SetRawReissueAssetResponseStruct_(const_cfd::js::api::SetRawReissueAssetRequestStruct_&)>
  ::~function(&local_38);
  return this;
}

Assistant:

std::string JsonMappingApi::SetRawReissueAsset(
    const std::string &request_message) {
  return ExecuteJsonApi<
      api::json::SetRawReissueAssetRequest,
      api::json::SetRawReissueAssetResponse,
      api::SetRawReissueAssetRequestStruct,
      api::SetRawReissueAssetResponseStruct>(
      request_message, ElementsTransactionStructApi::SetRawReissueAsset);
}